

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int advance(dwarf_buf *buf,size_t count)

{
  int iVar1;
  size_t count_local;
  dwarf_buf *buf_local;
  
  iVar1 = require(buf,count);
  if (iVar1 != 0) {
    buf->buf = buf->buf + count;
    buf->left = buf->left - count;
  }
  buf_local._4_4_ = (uint)(iVar1 != 0);
  return buf_local._4_4_;
}

Assistant:

static int
advance (struct dwarf_buf *buf, size_t count)
{
  if (!require (buf, count))
    return 0;
  buf->buf += count;
  buf->left -= count;
  return 1;
}